

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

void http_sconn_txdone(void *arg)

{
  nng_err nVar1;
  
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x3d8));
  if ((nVar1 == NNG_OK) && (*(char *)((long)arg + 0x30) != '\x01')) {
    *(undefined8 *)((long)arg + 0x20) = 0;
    if (*(size_t *)((long)arg + 0x38) != 0) {
      nni_http_read_discard
                (*(nng_http **)((long)arg + 0x10),*(size_t *)((long)arg + 0x38),
                 (nni_aio *)((long)arg + 0x210));
      return;
    }
    nni_http_read_req(*(nng_http **)((long)arg + 0x10),(nni_aio *)((long)arg + 0x210));
    return;
  }
  http_sconn_close((http_sconn *)arg);
  return;
}

Assistant:

static void
http_sconn_txdone(void *arg)
{
	http_sconn *sc  = arg;
	nni_aio    *aio = &sc->txaio;

	if (nni_aio_result(aio) != NNG_OK) {
		http_sconn_close(sc);
		return;
	}

	if (sc->close) {
		http_sconn_close(sc);
		return;
	}

	sc->handler = NULL;
	if (sc->unconsumed_body) {
		nni_http_read_discard(
		    sc->conn, sc->unconsumed_body, &sc->rxaio);
	} else {
		nni_http_read_req(sc->conn, &sc->rxaio);
	}
}